

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_>::Data
          (Data<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_> *this,
          Data<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_> *other)

{
  Span *pSVar1;
  Entry *pEVar2;
  Data *pDVar3;
  Data *pDVar4;
  Data *pDVar5;
  qreal qVar6;
  qreal qVar7;
  qreal qVar8;
  qreal qVar9;
  qreal qVar10;
  ulong uVar11;
  Node<int,_QXcbConnection::TouchDeviceData> *pNVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  R RVar16;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar14 = other->numBuckets;
  sVar15 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar15;
  this->spans = (Span *)0x0;
  RVar16 = allocateSpans(sVar14);
  this->spans = (Span *)RVar16.spans;
  if (RVar16.nSpans != 0) {
    lVar13 = 0;
    sVar14 = 0;
    do {
      pSVar1 = other->spans;
      sVar15 = 0;
      do {
        uVar11 = (ulong)pSVar1->offsets[sVar15 + lVar13];
        if (uVar11 != 0xff) {
          pEVar2 = pSVar1[sVar14].entries;
          pNVar12 = Span<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_>::insert
                              (this->spans + sVar14,sVar15);
          pNVar12->key = *(int *)pEVar2[uVar11].storage.data;
          (pNVar12->value).qtTouchDevice = *(QPointingDevice **)(pEVar2[uVar11].storage.data + 8);
          pDVar3 = *(Data **)(pEVar2[uVar11].storage.data + 0x10);
          (pNVar12->value).touchPoints.d = pDVar3;
          if ((pDVar3 != (Data *)0x0) &&
             ((pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
            LOCK();
            (pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i =
                 (pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pDVar4 = *(Data **)(pEVar2[uVar11].storage.data + 0x18);
          (pNVar12->value).pointPressedPosition.d = pDVar4;
          if ((pDVar4 != (Data *)0x0) &&
             ((pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
            LOCK();
            (pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i =
                 (pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pDVar5 = *(Data **)(pEVar2[uVar11].storage.data + 0x20);
          (pNVar12->value).valuatorInfo.d.d = pDVar5;
          (pNVar12->value).valuatorInfo.d.ptr =
               *(ValuatorClassInfo **)(pEVar2[uVar11].storage.data + 0x28);
          (pNVar12->value).valuatorInfo.d.size = *(qsizetype *)(pEVar2[uVar11].storage.data + 0x30);
          if (pDVar5 != (Data *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          (pNVar12->value).providesTouchOrientation = (bool)pEVar2[uVar11].storage.data[0x68];
          qVar6 = *(qreal *)(pEVar2[uVar11].storage.data + 0x38);
          qVar7 = *(qreal *)(pEVar2[uVar11].storage.data + 0x40);
          qVar8 = *(qreal *)(pEVar2[uVar11].storage.data + 0x48);
          qVar9 = *(qreal *)(pEVar2[uVar11].storage.data + 0x50);
          qVar10 = *(qreal *)(pEVar2[uVar11].storage.data + 0x60);
          (pNVar12->value).size.wd = *(qreal *)(pEVar2[uVar11].storage.data + 0x58);
          (pNVar12->value).size.ht = qVar10;
          (pNVar12->value).firstPressedNormalPosition.xp = qVar8;
          (pNVar12->value).firstPressedNormalPosition.yp = qVar9;
          (pNVar12->value).firstPressedPosition.xp = qVar6;
          (pNVar12->value).firstPressedPosition.yp = qVar7;
        }
        sVar15 = sVar15 + 1;
      } while (sVar15 != 0x80);
      sVar14 = sVar14 + 1;
      lVar13 = lVar13 + 0x90;
    } while (sVar14 != RVar16.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }